

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitCommonExpr(EExpr *__return_storage_ptr__,
                 ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,Reference r)

{
  pointer pEVar1;
  long lVar2;
  ExprBase e;
  pointer pEVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer piVar7;
  int *piVar8;
  size_t index_1;
  ulong uVar9;
  size_ty request;
  undefined8 *puVar10;
  QuadraticExpr *this_00;
  int *piVar11;
  vector<int,_std::allocator<int>_> *this_01;
  bool bVar12;
  int index;
  LinTerms le;
  EExpr eexpr;
  int local_454;
  AlgebraicExpression<mp::QuadAndLinTerms> *local_450;
  long local_448;
  vector<int,_std::allocator<int>_> *local_440;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_438;
  ulong local_430;
  undefined1 local_428 [72];
  int *local_3e0;
  ulong local_3d8;
  size_ty local_3d0;
  int local_3c8 [6];
  QuadraticExpr local_3b0;
  EExpr local_1f0;
  long lVar6;
  
  iVar5 = *(int *)((long)r.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                         impl_ + 4);
  uVar9 = (ulong)iVar5;
  iVar4 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])(this);
  lVar6 = CONCAT44(extraout_var,iVar4);
  if (this->dvelim_ == 2) {
    bVar12 = true;
  }
  else if (this->dvelim_ == 1) {
    bVar12 = *(int *)(*(long *)(lVar6 + 0x2e0) + uVar9 * 4) != 0;
  }
  else {
    bVar12 = false;
  }
  this_01 = &this->common_exprs_;
  piVar7 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar7) >> 2) <= iVar5)
  {
    iVar5 = (*(this->
              super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              ).
              super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
              .
              super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
              ._vptr_BasicExprVisitor[0x12])(this);
    local_3b0.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (this_01,(long)((int)((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x2b8) -
                                           *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x2b0)) >> 3)
                             * -0x11111111),(value_type *)&local_3b0);
    piVar7 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->dvelim_ != 0) {
      std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::resize
                (&this->common_ee_,
                 (long)(this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar7 >> 2);
      piVar7 = (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  if (piVar7[uVar9] < 0) {
    lVar2 = *(long *)(lVar6 + 0x2b0);
    local_428._0_8_ = local_428 + 0x18;
    local_428._8_8_ = 6;
    local_428._16_8_ = 0;
    local_3d8 = 6;
    local_3e0 = local_3c8;
    local_3d0 = 0;
    request = (size_ty)*(int *)(lVar2 + 0x10 + uVar9 * 0x78);
    local_450 = &__return_storage_ptr__->super_QuadraticExpr;
    local_448 = lVar6;
    local_440 = this_01;
    local_438 = this;
    local_430 = uVar9;
    gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
              ((small_vector_base<std::allocator<double>,_6U> *)local_428,request);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
              ((small_vector_base<std::allocator<int>,_6U> *)&local_3e0,request);
    puVar10 = (undefined8 *)(lVar2 + uVar9 * 0x78);
    piVar8 = (int *)*puVar10;
    for (piVar11 = piVar8; piVar11 != piVar8 + puVar10[2] * 4; piVar11 = piVar11 + 4) {
      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = *(ptr *)(piVar11 + 2);
      local_454 = *piVar11;
      gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                ((small_vector_base<std::allocator<double>,6u> *)local_428,(double *)&local_1f0);
      gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                ((small_vector_base<std::allocator<int>,6u> *)&local_3e0,&local_454);
      piVar8 = (int *)*puVar10;
    }
    EExpr::EExpr((EExpr *)&local_3b0,(LinTerms *)local_428);
    uVar9 = local_430;
    this = local_438;
    this_01 = local_440;
    lVar6 = local_448;
    if (6 < local_3d8) {
      operator_delete(local_3e0,local_3d8 << 2);
    }
    if (6 < (ulong)local_428._8_8_) {
      operator_delete((void *)local_428._0_8_,local_428._8_8_ << 3);
    }
    lVar2 = *(long *)(lVar6 + 0x2c8);
    if ((uVar9 < (ulong)(*(long *)(lVar6 + 0x2d0) - lVar2 >> 3)) &&
       (e.impl_ = ((ExprBase *)(lVar2 + uVar9 * 8))->impl_, e.impl_ != (Impl *)0x0)) {
      BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ::Visit(&local_1f0,
              (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
               *)this,(Expr)e.impl_);
      LinTerms::add((LinTerms *)&local_3b0,(LinTerms *)&local_1f0);
      QuadTerms::add(&local_3b0.super_QuadAndLinTerms.super_QuadTerms,
                     &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms);
      local_3b0.constant_term_ =
           local_1f0.super_QuadraticExpr.constant_term_ + local_3b0.constant_term_;
      if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                        coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (8 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
    }
    if (bVar12) {
      (this->common_exprs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = 0;
      this_00 = &(this->common_ee_).super__Vector_base<mp::EExpr,_std::allocator<mp::EExpr>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9].super_QuadraticExpr;
      if (&local_3b0 != this_00) {
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  ((small_vector_base<std::allocator<double>,_6U> *)this_00,
                   (small_vector_base<std::allocator<double>,_6U> *)&local_3b0);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(((QuadraticExpr *)&this_00->super_QuadAndLinTerms)->super_QuadAndLinTerms).
                    super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>,
                   &local_3b0.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>);
        gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
        ::move_assign_default<8U,_nullptr>
                  ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )&(((QuadraticExpr *)&this_00->super_QuadAndLinTerms)->super_QuadAndLinTerms).
                     super_QuadTerms,
                   (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )&local_3b0.super_QuadAndLinTerms.super_QuadTerms);
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  (&(((QuadraticExpr *)&this_00->super_QuadAndLinTerms)->super_QuadAndLinTerms).
                    super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>,
                   &local_3b0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(((QuadraticExpr *)&this_00->super_QuadAndLinTerms)->super_QuadAndLinTerms).
                    super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>,
                   &local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(((QuadraticExpr *)&this_00->super_QuadAndLinTerms)->super_QuadAndLinTerms).
                    super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>,
                   &local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>);
      }
      this_00->constant_term_ = local_3b0.constant_term_;
    }
    else {
      iVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::Convert2Var((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             *)&this->flat_cvt_,&local_3b0);
      (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = iVar5;
    }
    __return_storage_ptr__ = (EExpr *)local_450;
    if (6 < local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3b0.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3b0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3b0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3b0.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_3b0.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_3b0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_3b0.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_3b0.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3b0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3b0.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3b0.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete((void *)CONCAT44(local_3b0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                       super_small_vector_data_base<double_*,_unsigned_long>.
                                       m_data_ptr._4_4_,
                                       local_3b0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                       super_small_vector_data_base<double_*,_unsigned_long>.
                                       m_data_ptr._0_4_),
                      local_3b0.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
  }
  if (bVar12) {
    pEVar3 = (this->common_ee_).super__Vector_base<mp::EExpr,_std::allocator<mp::EExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar1 = pEVar3 + uVar9;
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,pEVar1);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)
               &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
                vars_,&pEVar3[uVar9].super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_)
    ;
    QuadTerms::QuadTerms
              (&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms,
               &(pEVar1->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms);
    (__return_storage_ptr__->super_QuadraticExpr).constant_term_ =
         (pEVar1->super_QuadraticExpr).constant_term_;
  }
  else {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,
               (Variable)
               (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9]);
  }
  return (EExpr *)&__return_storage_ptr__->super_QuadraticExpr;
}

Assistant:

EExpr VisitCommonExpr(Reference r) {
    const auto index = r.index();
    auto ce = MP_DISPATCH( GetModel() ).common_expr(index);
    MP_ASSERT_ALWAYS(ce.is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    bool dvelim
        = 2==defvarelim()         // always inline
          || (1==defvarelim()
              && ce.position());  // used only 1x. @todo own ref count #153
    if (index >= (int)common_exprs_.size()) {
      assert(index < GetModel().num_common_exprs());
      common_exprs_.resize(
                  GetModel().num_common_exprs(),
                  -1);          // init by -1, "no variable"
      if (defvarelim())
        common_ee_.resize(common_exprs_.size());
    }
    if (common_exprs_[index]<0) {                 // not yet converted
      EExpr eexpr( ToLinTerms(ce.linear_expr()) );
      if (ce.nonlinear_expr())
        eexpr.add( Convert2EExpr(ce.nonlinear_expr()) );
      if (dvelim) {             // provide the eexpr itself
        common_exprs_[index] = 0;
        assert((int)common_ee_.size() > index);
        common_ee_[index] = std::move(eexpr);
      } else                            // convert 2 var
        common_exprs_[index] = Convert2Var(std::move(eexpr));
    }
    if (dvelim)
      return common_ee_[index];
    return EExpr::Variable{ common_exprs_[index] };
  }